

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cc
# Opt level: O2

void __thiscall board::Board::reset(Board *this)

{
  pointer pUVar1;
  long lVar2;
  int (*paiVar3) [10];
  int i;
  int j;
  long lVar4;
  
  for (lVar2 = 0; lVar2 != 0x1e0; lVar2 = lVar2 + 4) {
    *(undefined4 *)((long)this->board + lVar2) = 99;
  }
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 4) {
    this->board[*(int *)((long)SQ120 + lVar2)] = 0;
  }
  for (lVar2 = 0x200; lVar2 != 0x218; lVar2 = lVar2 + 8) {
    *(undefined8 *)((long)this->board + lVar2) = 0;
  }
  paiVar3 = this->pList;
  for (lVar2 = 0; lVar2 != 0xd; lVar2 = lVar2 + 1) {
    this->pNum[lVar2] = 0;
    for (lVar4 = 0; lVar4 != 10; lVar4 = lVar4 + 1) {
      (*paiVar3)[lVar4] = 0;
    }
    paiVar3 = paiVar3 + 1;
  }
  this->material[0] = 0;
  this->material[1] = 0;
  this->side = 2;
  this->ply = 0;
  this->fiftyMove = 0;
  this->enPas = 99;
  this->castlePerm = 0;
  this->hashKey = 0;
  pUVar1 = (this->history).super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->history).super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
      super__Vector_impl_data._M_finish != pUVar1) {
    (this->history).super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
    super__Vector_impl_data._M_finish = pUVar1;
  }
  clearSearchKillers(this);
  clearSearchHistory(this);
  return;
}

Assistant:

void board::Board::reset()
{
    std::fill(std::begin(board), std::end(board), NO_SQ);
    for (int i : SQ120) {
        board[i] = EMPTY;
    }
    std::fill(std::begin(pawns), std::end(pawns), 0ULL);
    for (int i = 0; i < 13; i++) {
        pNum[i] = 0;
        for (int j = 0; j < 10; j++) {
            pList[i][j] = 0;
        }
    }
    material[WHITE] = 0;
    material[BLACK] = 0;
    side = BOTH;
    ply = 0;
    fiftyMove = 0;
    enPas = NO_SQ;
    castlePerm = 0;
    hashKey = 0ULL;
    history.clear();
    clearSearchKillers();
    clearSearchHistory();
}